

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm_sse2.h
# Opt level: O0

void store_rect_buffer_16bit_to_32bit_w8(__m128i *in,int32_t *out,int stride,int out_size)

{
  int in_ECX;
  int i;
  int32_t *in_stack_00000028;
  undefined1 in_stack_00000030 [16];
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < in_ECX; local_1c = local_1c + 1) {
    store_rect_16bit_to_32bit((__m128i)in_stack_00000030,in_stack_00000028);
  }
  return;
}

Assistant:

static inline void store_rect_buffer_16bit_to_32bit_w8(const __m128i *const in,
                                                       int32_t *const out,
                                                       const int stride,
                                                       const int out_size) {
  for (int i = 0; i < out_size; ++i) {
    store_rect_16bit_to_32bit(in[i], out + i * stride);
  }
}